

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::clara::TextFlow::Column::iterator::iterator(iterator *this,Column *column)

{
  this->m_column = column;
  this->m_stringIndex = 0;
  this->m_pos = 0;
  this->m_len = 0;
  this->m_end = 0;
  this->m_suffix = false;
  if (column->m_width <= column->m_indent) {
    __assert_fail("m_column.m_width > m_column.m_indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/catch.hpp"
                  ,0x2177,"Catch::clara::TextFlow::Column::iterator::iterator(const Column &)");
  }
  if (column->m_initialIndent < column->m_width || column->m_initialIndent == 0xffffffffffffffff) {
    calcLength(this);
    if (this->m_len == 0) {
      this->m_stringIndex = this->m_stringIndex + 1;
    }
    return;
  }
  __assert_fail("m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/catch.hpp"
                ,0x2178,"Catch::clara::TextFlow::Column::iterator::iterator(const Column &)");
}

Assistant:

explicit iterator(Column const& column) : m_column(column) {
			assert(m_column.m_width > m_column.m_indent);
			assert(m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent);
			calcLength();
			if (m_len == 0)
				m_stringIndex++; // Empty string
		}